

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

bool __thiscall
QDockAreaLayoutInfo::restoreState
          (QDockAreaLayoutInfo *this,QDataStream *stream,QList<QDockWidget_*> *widgets,bool testing)

{
  QList<QDockAreaLayoutItem> *this_00;
  int iVar1;
  QMainWindow *pQVar2;
  Orientation OVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  QDataStream *pQVar7;
  QWidget *this_01;
  QLayoutItem *pQVar8;
  iterator iVar9;
  QDockAreaLayoutItem *pQVar10;
  QPlaceHolderItem *this_02;
  quintptr id;
  uint uVar11;
  int iVar12;
  ulong i;
  DockWidgetArea _t1;
  long in_FS_OFFSET;
  QRect rect;
  int dummy_1;
  undefined1 auStack_bc [12];
  int h;
  int w;
  int y;
  int x;
  uchar flags;
  int dummy_3;
  undefined4 uStack_94;
  char16_t *pcStack_90;
  long local_88;
  uchar nextMarker;
  int cnt;
  uchar orientation;
  int index;
  uchar marker;
  int dummy;
  undefined4 uStack_64;
  QDockAreaLayoutInfo *pQStack_60;
  QPlaceHolderItem *local_58;
  int iStack_50;
  int iStack_4c;
  uint uStack_48;
  undefined4 uStack_44;
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  marker = 0xaa;
  QDataStream::operator>>(stream,&marker);
  if ((marker == 0xfc) || (marker == 0xfa)) {
    this->tabbed = marker == 0xfa;
    index = -1;
    if (marker == 0xfa) {
      QDataStream::operator>>(stream,&index);
    }
    orientation = 0xaa;
    QDataStream::operator>>(stream,&orientation);
    this->o = (uint)orientation;
    cnt = -0x55555556;
    QDataStream::operator>>(stream,&cnt);
    this_00 = &this->item_list;
    iVar12 = 0;
    while( true ) {
      bVar5 = cnt <= iVar12;
      if (cnt <= iVar12) break;
      nextMarker = 0xaa;
      QDataStream::operator>>(stream,&nextMarker);
      if (nextMarker == 0xfc) {
        _dummy_3 = (Data *)CONCAT44(uStack_94,0xaaaaaaaa);
        uStack_48 = 0xaaaaaaaa;
        uStack_44 = 0xaaaaaaaa;
        pQStack_60 = (QDockAreaLayoutInfo *)operator_new(0x70);
        iVar1 = this->tabBarShape;
        pQVar2 = this->mainWindow;
        pQStack_60->sep = this->sep;
        (pQStack_60->separatorWidgets).d.size = 0;
        (pQStack_60->separatorWidgets).d.d = (Data *)0x0;
        (pQStack_60->separatorWidgets).d.ptr = (QWidget **)0x0;
        OVar3 = this->o;
        pQStack_60->dockPos = this->dockPos;
        pQStack_60->o = OVar3;
        (pQStack_60->rect).x1 = 0;
        (pQStack_60->rect).y1 = 0;
        (pQStack_60->rect).x2 = -1;
        (pQStack_60->rect).y2 = -1;
        pQStack_60->mainWindow = pQVar2;
        pQStack_60->tabBar = (QTabBar *)0x0;
        *(undefined8 *)((long)&(pQStack_60->item_list).d.ptr + 1) = 0;
        *(undefined8 *)((long)&(pQStack_60->item_list).d.size + 1) = 0;
        (pQStack_60->item_list).d.d = (Data *)0x0;
        (pQStack_60->item_list).d.ptr = (QDockAreaLayoutItem *)0x0;
        pQStack_60->tabBarShape = iVar1;
        _dummy = (QLayoutItem *)0x0;
        local_58 = (QPlaceHolderItem *)0x0;
        iStack_50 = 0;
        iStack_4c = -1;
        uStack_48 = 0;
        pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&iStack_50);
        pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&iStack_4c);
        pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&dummy_3);
        QDataStream::operator>>(pQVar7,&dummy_3);
        pQVar10 = (QDockAreaLayoutItem *)&dummy;
        if (!testing) {
          QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem_const&>
                    (this_00,(QDockAreaLayoutItem *)&dummy);
          iVar9 = QList<QDockAreaLayoutItem>::end(this_00);
          pQVar10 = iVar9.i + -1;
        }
        bVar6 = restoreState(pQVar10->subinfo,stream,widgets,testing);
        QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)&dummy);
        if (!bVar6) goto LAB_003cc98a;
      }
      else {
        if (nextMarker != 0xfb) goto LAB_003cc98a;
        _dummy_3 = (Data *)0x0;
        pcStack_90 = (char16_t *)0x0;
        local_88 = 0;
        flags = 0xaa;
        pQVar7 = (QDataStream *)::operator>>(stream,(QString *)&dummy_3);
        QDataStream::operator>>(pQVar7,&flags);
        if (local_88 == 0) {
          _dummy = (QLayoutItem *)CONCAT44(uStack_64,0xaaaaaaaa);
          pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&dummy);
          pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&dummy);
          pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&dummy);
          QDataStream::operator>>(pQVar7,&dummy);
        }
        else {
          uVar4 = 0;
          do {
            i = uVar4;
            if ((ulong)(widgets->d).size <= i) goto LAB_003cc654;
            QObject::objectName();
            bVar5 = ::comparesEqual((QString *)&dummy,(QString *)&dummy_3);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dummy);
            uVar4 = i + 1;
          } while (!bVar5);
          this_01 = &QList<QDockWidget_*>::takeAt(widgets,i)->super_QWidget;
          if (this_01 == (QWidget *)0x0) {
LAB_003cc654:
            this_02 = (QPlaceHolderItem *)operator_new(0x30);
            (this_02->objectName).d.d = (Data *)0x0;
            (this_02->objectName).d.ptr = (char16_t *)0x0;
            *(undefined8 *)((long)&(this_02->objectName).d.ptr + 2) = 0;
            *(undefined8 *)((long)&(this_02->objectName).d.size + 2) = 0;
            (this_02->topLevelRect).x1 = 0;
            (this_02->topLevelRect).y1 = 0;
            (this_02->topLevelRect).x2 = -1;
            (this_02->topLevelRect).y2 = -1;
            uStack_44 = 0xaaaaaaaa;
            _dummy = (QLayoutItem *)0x0;
            pQStack_60 = (QDockAreaLayoutInfo *)0x0;
            iStack_50 = 0;
            iStack_4c = -1;
            uStack_48 = 0;
            local_58 = this_02;
            QString::operator=((QString *)this_02,(QString *)&dummy_3);
            bVar5 = (bool)(flags >> 1 & 1);
            this_02->window = bVar5;
            this_02->hidden = (bool)(~flags & 1);
            if (bVar5 == false) {
              dummy_1 = -0x55555556;
              pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&iStack_50);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&iStack_4c);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&dummy_1);
              QDataStream::operator>>(pQVar7,&dummy_1);
            }
            else {
              dummy_1 = -0x55555556;
              x = -0x55555556;
              y = -0x55555556;
              w = -0x55555556;
              pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&dummy_1);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&x);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&y);
              QDataStream::operator>>(pQVar7,&w);
              (this_02->topLevelRect).x1.m_i = dummy_1;
              (this_02->topLevelRect).y1.m_i = x;
              (this_02->topLevelRect).x2.m_i = dummy_1 + -1 + y;
              (this_02->topLevelRect).y2.m_i = x + -1 + w;
            }
            if (iStack_4c != -1) {
              uStack_48 = uStack_48 | 2;
            }
            if (!testing) {
              QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem_const&>
                        (this_00,(QDockAreaLayoutItem *)&dummy);
            }
          }
          else {
            uStack_48 = 0xaaaaaaaa;
            uStack_44 = 0xaaaaaaaa;
            local_58 = (QPlaceHolderItem *)&DAT_aaaaaaaaaaaaaaaa;
            iStack_50 = -0x55555556;
            iStack_4c = -0x55555556;
            _dummy = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
            pQStack_60 = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar8 = (QLayoutItem *)operator_new(0x18);
            QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)pQVar8,(QDockWidget *)this_01);
            iStack_50 = 0;
            pQStack_60 = (QDockAreaLayoutInfo *)0x0;
            local_58 = (QPlaceHolderItem *)0x0;
            iStack_4c = -1;
            uStack_48 = 0;
            _dummy = pQVar8;
            if ((flags & 2) == 0) {
              dummy_1 = -0x55555556;
              pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&iStack_50);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&iStack_4c);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&dummy_1);
              QDataStream::operator>>(pQVar7,&dummy_1);
              if (!testing) {
                QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem_const&>
                          (this_00,(QDockAreaLayoutItem *)&dummy);
                QDockWidget::setFloating((QDockWidget *)this_01,false);
                (**(code **)(*(long *)this_01 + 0x68))(this_01);
                _t1 = NoDockWidgetArea;
                if ((ulong)this->dockPos < 4) {
                  _t1 = *(DockWidgetArea *)(&DAT_0065a0b0 + (ulong)this->dockPos * 4);
                }
                QDockWidget::dockLocationChanged((QDockWidget *)this_01,_t1);
              }
            }
            else {
              if (!testing) {
                QWidget::hide(this_01);
                QDockWidget::setFloating((QDockWidget *)this_01,true);
              }
              x = -0x55555556;
              y = -0x55555556;
              w = -0x55555556;
              h = -0x55555556;
              pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&x);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&y);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&w);
              QDataStream::operator>>(pQVar7,&h);
              if (!testing) {
                rect.x1.m_i = x + w + -1;
                uVar11 = (y + h) - 1;
                rect.y1.m_i = uVar11;
                rect._8_8_ = this_01;
                _dummy_1 = QDockAreaLayout::constrainedRect
                                     ((QDockAreaLayout *)CONCAT44(y,x),rect,
                                      (QWidget *)((ulong)uVar11 << 0x20));
                QWidget::setGeometry(this_01,(QRect *)&dummy_1);
                (**(code **)(*(long *)this_01 + 0x68))(this_01,flags & 1);
                QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem_const&>
                          (this_00,(QDockAreaLayoutItem *)&dummy);
              }
            }
            if (testing) {
              if (_dummy != (QLayoutItem *)0x0) {
                (*(((QWidgetItem *)&_dummy->_vptr_QLayoutItem)->super_QLayoutItem)._vptr_QLayoutItem
                  [1])();
              }
              _dummy = (QLayoutItem *)0x0;
            }
          }
          QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)&dummy);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dummy_3);
      }
      iVar12 = iVar12 + 1;
    }
    if (!testing) {
      if (((-1 < index & this->tabbed) == 1) &&
         ((ulong)(uint)index < (ulong)(this->item_list).d.size)) {
        updateTabBar(this);
        pQVar8 = (this->item_list).d.ptr[index].widgetItem;
        if (pQVar8 == (QLayoutItem *)0x0) {
          id = 0;
        }
        else {
          iVar12 = (*pQVar8->_vptr_QLayoutItem[0xd])();
          id = CONCAT44(extraout_var,iVar12);
        }
        setCurrentTabId(this,id);
      }
      if (*this->sep == 1) {
        updateSeparatorWidgets(this);
      }
    }
  }
  else {
    bVar5 = false;
  }
LAB_003cc98a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QDockAreaLayoutInfo::restoreState(QDataStream &stream, QList<QDockWidget*> &widgets, bool testing)
{
    uchar marker;
    stream >> marker;
    if (marker != TabMarker && marker != SequenceMarker)
        return false;

#if QT_CONFIG(tabbar)
    tabbed = marker == TabMarker;

    int index = -1;
    if (tabbed)
        stream >> index;
#endif

    uchar orientation;
    stream >> orientation;
    o = static_cast<Qt::Orientation>(orientation);

    int cnt;
    stream >> cnt;

    for (int i = 0; i < cnt; ++i) {
        uchar nextMarker;
        stream >> nextMarker;
        if (nextMarker == WidgetMarker) {
            QString name;
            uchar flags;
            stream >> name >> flags;
            if (name.isEmpty()) {
                int dummy;
                stream >> dummy >> dummy >> dummy >> dummy;
                continue;
            }

            QDockWidget *widget = nullptr;
            for (int j = 0; j < widgets.size(); ++j) {
                if (widgets.at(j)->objectName() == name) {
                    widget = widgets.takeAt(j);
                    break;
                }
            }

            if (widget == nullptr) {
                QPlaceHolderItem *placeHolder = new QPlaceHolderItem;
                QDockAreaLayoutItem item(placeHolder);

                placeHolder->objectName = name;
                placeHolder->window = flags & StateFlagFloating;
                placeHolder->hidden = !(flags & StateFlagVisible);
                if (placeHolder->window) {
                    int x, y, w, h;
                    stream >> x >> y >> w >> h;
                    placeHolder->topLevelRect = QRect(x, y, w, h);
                } else {
                    int dummy;
                    stream >> item.pos >> item.size >> dummy >> dummy;
                }
                if (item.size != -1)
                    item.flags |= QDockAreaLayoutItem::KeepSize;
                if (!testing)
                    item_list.append(item);
            } else {
                QDockAreaLayoutItem item(new QDockWidgetItem(widget));
                if (flags & StateFlagFloating) {
                    bool drawer = false;

                    if (!testing) {
                        widget->hide();
                        if (!drawer)
                            widget->setFloating(true);
                    }

                    int x, y, w, h;
                    stream >> x >> y >> w >> h;

                    if (!testing)
                        widget->setGeometry(QDockAreaLayout::constrainedRect(QRect(x, y, w, h), widget));

                    if (!testing) {
                        widget->setVisible(flags & StateFlagVisible);
                        item_list.append(item);
                    }
                } else {
                    int dummy;
                    stream >> item.pos >> item.size >> dummy >> dummy;
                    if (!testing) {
                        item_list.append(item);
                        widget->setFloating(false);
                        widget->setVisible(flags & StateFlagVisible);
                        emit widget->dockLocationChanged(toDockWidgetArea(dockPos));
                    }
                }
                if (testing) {
                    //was it is not really added to the layout, we need to delete the object here
                    delete item.widgetItem;
                    item.widgetItem = nullptr;
                }
            }
        } else if (nextMarker == SequenceMarker) {
            int dummy;
#if !QT_CONFIG(tabbar)
            const int tabBarShape = 0;
#endif
            QDockAreaLayoutItem item(new QDockAreaLayoutInfo(sep, dockPos, o,
                                                                tabBarShape, mainWindow));
            stream >> item.pos >> item.size >> dummy >> dummy;
            //we need to make sure the element is in the list so the dock widget can eventually be docked correctly
            if (!testing)
                item_list.append(item);

            //here we need to make sure we change the item in the item_list
            QDockAreaLayoutItem &lastItem = testing ? item : item_list.last();

            if (!lastItem.subinfo->restoreState(stream, widgets, testing))
                return false;

        } else {
            return false;
        }
    }

#if QT_CONFIG(tabbar)
    if (!testing && tabbed && index >= 0 && index < item_list.size()) {
        updateTabBar();
        setCurrentTabId(tabId(item_list.at(index)));
    }
    if (!testing && *sep == 1)
        updateSeparatorWidgets();
#endif

    return true;
}